

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitcoin-util.cpp
# Opt level: O0

void grind_task(uint32_t nBits,CBlockHeader header,uint32_t offset,uint32_t step,atomic<bool> *found
               ,uint32_t *proposed_nonce)

{
  long lVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  undefined8 in_RCX;
  uint32_t nCompact;
  uint in_EDX;
  uint32_t in_ESI;
  CBlockHeader *in_R8;
  long in_FS_OFFSET;
  uint32_t next;
  uint32_t finish;
  bool over;
  bool neg;
  arith_uint256 target;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  uint in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  base_uint<256U> *a;
  uint32_t in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  byte local_6a;
  byte local_69;
  
  nCompact = (uint32_t)((ulong)in_RCX >> 0x20);
  a = (base_uint<256U> *)&stack0x00000008;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  arith_uint256::arith_uint256
            ((arith_uint256 *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  arith_uint256::SetCompact
            ((arith_uint256 *)CONCAT44(in_ESI,in_EDX),nCompact,(bool *)in_R8,
             (bool *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  bVar3 = operator==(a,CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  if (((!bVar3) && ((local_69 & 1) == 0)) && ((local_6a & 1) == 0)) {
    a[2].pn[3] = in_ESI;
    uVar4 = std::numeric_limits<unsigned_int>::max();
    uVar4 = uVar4 - in_EDX;
    uVar5 = (uVar4 - uVar4 % in_EDX) + in_ESI;
    while( true ) {
      bVar3 = std::atomic::operator_cast_to_bool
                        ((atomic<bool> *)CONCAT44(uVar5,in_stack_ffffffffffffff70));
      uVar2 = in_stack_ffffffffffffff60 & 0xffffff;
      if (!bVar3) {
        uVar2 = CONCAT13(a[2].pn[3] < uVar5,(int3)in_stack_ffffffffffffff60);
      }
      in_stack_ffffffffffffff60 = uVar2;
      if ((char)(in_stack_ffffffffffffff60 >> 0x18) == '\0') break;
      in_stack_ffffffffffffff70 = uVar5;
      if (in_EDX * 5000 <= uVar5 - a[2].pn[3]) {
        in_stack_ffffffffffffff70 = a[2].pn[3] + in_EDX * 5000;
      }
      do {
        CBlockHeader::GetHash(in_R8);
        UintToArith256((uint256 *)CONCAT44(uVar5,in_stack_ffffffffffffff70));
        bVar3 = operator<=(a,(base_uint<256U> *)CONCAT44(uVar4,in_stack_ffffffffffffff60));
        if (bVar3) {
          bVar3 = std::atomic<bool>::exchange
                            ((atomic<bool> *)CONCAT44(uVar5,in_stack_ffffffffffffff70),
                             SUB81((ulong)a >> 0x38,0),(memory_order)a);
          if (!bVar3) {
            in_R8->nVersion = a[2].pn[3];
          }
          goto LAB_0010ebf0;
        }
        a[2].pn[3] = in_EDX + a[2].pn[3];
      } while (a[2].pn[3] != in_stack_ffffffffffffff70);
    }
  }
LAB_0010ebf0:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void grind_task(uint32_t nBits, CBlockHeader header, uint32_t offset, uint32_t step, std::atomic<bool>& found, uint32_t& proposed_nonce)
{
    arith_uint256 target;
    bool neg, over;
    target.SetCompact(nBits, &neg, &over);
    if (target == 0 || neg || over) return;
    header.nNonce = offset;

    uint32_t finish = std::numeric_limits<uint32_t>::max() - step;
    finish = finish - (finish % step) + offset;

    while (!found && header.nNonce < finish) {
        const uint32_t next = (finish - header.nNonce < 5000*step) ? finish : header.nNonce + 5000*step;
        do {
            if (UintToArith256(header.GetHash()) <= target) {
                if (!found.exchange(true)) {
                    proposed_nonce = header.nNonce;
                }
                return;
            }
            header.nNonce += step;
        } while(header.nNonce != next);
    }
}